

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Polyobj_OR_MoveToSpot
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  bool bVar1;
  uint uVar2;
  AActor *pAVar3;
  DVector2 local_38;
  FActorIterator iterator;
  
  iterator.base = (AActor *)0x0;
  iterator.id = arg2;
  pAVar3 = FActorIterator::Next(&iterator);
  if (pAVar3 == (AActor *)0x0) {
    uVar2 = 0;
  }
  else {
    local_38.X = (pAVar3->__Pos).X;
    local_38.Y = (pAVar3->__Pos).Y;
    bVar1 = EV_MovePolyTo(ln,arg0,(double)arg1 * 0.125,&local_38,true);
    uVar2 = (uint)bVar1;
  }
  return uVar2;
}

Assistant:

FUNC(LS_Polyobj_OR_MoveToSpot)
// Polyobj_OR_MoveToSpot (po, speed, tid)
{
	FActorIterator iterator (arg2);
	AActor *spot = iterator.Next();
	if (spot == NULL) return false;
	return EV_MovePolyTo (ln, arg0, SPEED(arg1), spot->Pos(), true);
}